

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O0

void __thiscall
OpenMD::OpenMDBitSet::setBits(OpenMDBitSet *this,size_t fromIndex,size_t toIndex,bool value)

{
  _Bit_iterator __last;
  _Bit_iterator __first;
  _Bit_type *p_Var1;
  iterator *in_RDI;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator last;
  iterator first;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uStack_24;
  
  std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x1a5f6b);
  iVar2 = std::operator+(in_RDI,0x1a5fa7);
  iVar3 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)0x1a5fd1);
  p_Var1 = iVar3.super__Bit_iterator_base._M_p;
  iVar4 = std::operator+(in_RDI,0x1a5ffe);
  __last.super__Bit_iterator_base._M_p._4_4_ = uStack_24;
  __last.super__Bit_iterator_base._M_p._0_4_ = iVar2.super__Bit_iterator_base._M_offset;
  __first.super__Bit_iterator_base._M_p._4_4_ = in_stack_ffffffffffffff6c;
  __first.super__Bit_iterator_base._M_p._0_4_ = iVar4.super__Bit_iterator_base._M_offset;
  __first.super__Bit_iterator_base._8_8_ = p_Var1;
  __last.super__Bit_iterator_base._8_8_ = iVar4.super__Bit_iterator_base._M_p;
  std::fill<std::_Bit_iterator,bool>(__first,__last,(bool *)iVar2.super__Bit_iterator_base._M_p);
  return;
}

Assistant:

void OpenMDBitSet::setBits(size_t fromIndex, size_t toIndex, bool value) {
    assert(fromIndex <= toIndex);
    assert(fromIndex >= 0);
    assert(toIndex <= size());
    std::vector<bool>::iterator first = bitset_.begin() + fromIndex;
    std::vector<bool>::iterator last  = bitset_.begin() + toIndex;
    std::fill(first, last, value);
  }